

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void int64_suite::test_max(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  size_type local_60;
  void *local_58;
  long lStack_50;
  long local_48;
  undefined4 local_3c;
  undefined **local_38 [5];
  
  local_38[1] = (undefined **)&local_58;
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  local_38[0] = &PTR__base_00112ca8;
  local_60 = trial::protocol::bintoken::detail::basic_encoder<24UL>::value
                       ((basic_encoder<24UL> *)local_38,0x7fffffffffffffff);
  local_3c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::numeric_limits<token::int64::type>::max())","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1af,"void int64_suite::test_max()",&local_60,&local_3c);
  local_60 = lStack_50 - (long)local_58;
  local_3c = 9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","9",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b0,"void int64_suite::test_max()",&local_60,&local_3c);
  local_60._0_4_ = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b1,"void int64_suite::test_max()",local_58,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[1]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b2,"void int64_suite::test_max()",(long)local_58 + 1,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[2]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b3,"void int64_suite::test_max()",(long)local_58 + 2,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[3]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b4,"void int64_suite::test_max()",(long)local_58 + 3,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[4]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b5,"void int64_suite::test_max()",(long)local_58 + 4,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[5]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b6,"void int64_suite::test_max()",(long)local_58 + 5,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[6]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b7,"void int64_suite::test_max()",(long)local_58 + 6,&local_60);
  local_60._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[7]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b8,"void int64_suite::test_max()",(long)local_58 + 7,&local_60);
  local_60 = CONCAT44(local_60._4_4_,0x7f);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[8]","0x7F",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x1b9,"void int64_suite::test_max()",(long)local_58 + 8,&local_60);
  (*(code *)*local_38[0])();
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}